

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flattening.cpp
# Opt level: O0

FormulaList * Shell::Flattening::flatten(FormulaList *fs,Connective con)

{
  ConstIterator it;
  bool bVar1;
  Connective CVar2;
  Formula *pFVar3;
  List<Kernel::Formula_*> *pLVar4;
  Formula *pFVar5;
  Connective in_ESI;
  Stack<Kernel::Formula_*> *in_RDI;
  FormulaList *resLst;
  Formula *hdRes;
  Stack<Lib::List<Kernel::Formula_*>_*> toDo;
  Stack<Kernel::Formula_*> res;
  bool modified;
  FormulaList *fs0;
  Formula *in_stack_fffffffffffffee8;
  Stack<Kernel::Formula_*> *in_stack_fffffffffffffef0;
  undefined7 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffeff;
  Stack<Kernel::Formula_*> *in_stack_ffffffffffffff00;
  Formula *in_stack_ffffffffffffff30;
  Stack<Lib::List<Kernel::Formula_*>_*> local_68 [2];
  byte local_21;
  Stack<Kernel::Formula_*> *local_20;
  Connective local_14;
  Stack<Kernel::Formula_*> *local_10;
  Stack<Kernel::Formula_*> *local_8;
  
  if (in_RDI == (Stack<Kernel::Formula_*> *)0x0) {
    local_8 = (Stack<Kernel::Formula_*> *)0x0;
  }
  else {
    local_21 = 0;
    local_20 = in_RDI;
    local_14 = in_ESI;
    local_10 = in_RDI;
    Lib::Stack<Kernel::Formula_*>::Stack
              (in_stack_ffffffffffffff00,
               CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
    Lib::Stack<Lib::List<Kernel::Formula_*>_*>::Stack
              ((Stack<Lib::List<Kernel::Formula_*>_*> *)in_stack_ffffffffffffff00,
               CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
    while( true ) {
      do {
        while( true ) {
          pFVar3 = Lib::List<Kernel::Formula_*>::head((List<Kernel::Formula_*> *)local_10);
          CVar2 = Kernel::Formula::connective(pFVar3);
          if (CVar2 != local_14) break;
          local_21 = 1;
          pLVar4 = Lib::List<Kernel::Formula_*>::tail((List<Kernel::Formula_*> *)local_10);
          if (pLVar4 != (List<Kernel::Formula_*> *)0x0) {
            Lib::List<Kernel::Formula_*>::tail((List<Kernel::Formula_*> *)local_10);
            Lib::Stack<Lib::List<Kernel::Formula_*>_*>::push
                      ((Stack<Lib::List<Kernel::Formula_*>_*> *)in_stack_fffffffffffffef0,
                       (List<Kernel::Formula_*> *)in_stack_fffffffffffffee8);
          }
          in_stack_ffffffffffffff30 =
               Lib::List<Kernel::Formula_*>::head((List<Kernel::Formula_*> *)local_10);
          local_10 = (Stack<Kernel::Formula_*> *)Kernel::Formula::args((Formula *)0xb994ba);
        }
        Lib::List<Kernel::Formula_*>::head((List<Kernel::Formula_*> *)local_10);
        pFVar3 = flatten(in_stack_ffffffffffffff30);
        pFVar5 = Lib::List<Kernel::Formula_*>::head((List<Kernel::Formula_*> *)local_10);
        if (pFVar3 != pFVar5) {
          local_21 = 1;
        }
        Lib::Stack<Kernel::Formula_*>::push(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
        local_10 = (Stack<Kernel::Formula_*> *)
                   Lib::List<Kernel::Formula_*>::tail((List<Kernel::Formula_*> *)local_10);
      } while (local_10 != (Stack<Kernel::Formula_*> *)0x0);
      bVar1 = Lib::Stack<Lib::List<Kernel::Formula_*>_*>::isEmpty(local_68);
      if (bVar1) break;
      in_stack_fffffffffffffef0 =
           (Stack<Kernel::Formula_*> *)Lib::Stack<Lib::List<Kernel::Formula_*>_*>::pop(local_68);
      local_10 = in_stack_fffffffffffffef0;
    }
    if ((local_21 & 1) == 0) {
      local_8 = local_20;
    }
    else {
      Lib::Stack<Kernel::Formula_*>::ConstIterator::ConstIterator
                ((ConstIterator *)in_stack_fffffffffffffef0,
                 (Stack<Kernel::Formula_*> *)in_stack_fffffffffffffee8);
      it.super_ConstRefIterator._stack = in_stack_fffffffffffffef0;
      it.super_ConstRefIterator._pointer = (Formula **)in_stack_fffffffffffffee8;
      Lib::List<Kernel::Formula*>::pushFromIterator<Lib::Stack<Kernel::Formula*>::ConstIterator>
                (it,(List<Kernel::Formula_*> **)0xb99626);
      local_8 = (Stack<Kernel::Formula_*> *)0x0;
    }
    Lib::Stack<Lib::List<Kernel::Formula_*>_*>::~Stack
              ((Stack<Lib::List<Kernel::Formula_*>_*> *)in_stack_fffffffffffffef0);
    Lib::Stack<Kernel::Formula_*>::~Stack(in_stack_fffffffffffffef0);
  }
  return (FormulaList *)local_8;
}

Assistant:

FormulaList* Flattening::flatten (FormulaList* fs, 
				  Connective con)
{
  ASS(con == OR || con == AND);

#if 1
  if(!fs) {
    return 0;
  }

  FormulaList* fs0 = fs;

  bool modified = false;
  Stack<Formula*> res(8);
  Stack<FormulaList*> toDo(8);
  for(;;) {
    if(fs->head()->connective()==con) {
      modified = true;
      if(fs->tail()) {
	toDo.push(fs->tail());
      }
      fs = fs->head()->args();
      continue;
    }
    Formula* hdRes = flatten(fs->head());
    if(hdRes!=fs->head()) {
      modified = true;
    }
    res.push(hdRes);
    fs = fs->tail();
    if(!fs) {
      if(toDo.isEmpty()) {
	break;
      }
      fs = toDo.pop();
    }
  }
  if(!modified) {
    return fs0;
  }
  FormulaList* resLst = 0;
  FormulaList::pushFromIterator(Stack<Formula*>::TopFirstIterator(res), resLst);
  return resLst;
#else
  if (fs->isEmpty()) {
    return fs;
  }
  Formula* head = flatten(fs->head());
  FormulaList* tail = flatten(fs->tail(),con);

  if (head->connective() == con) {
    return FormulaList::append(head->args(), tail);
  }

  if (head == fs->head() && tail == fs->tail()) {
    return fs;
  }
  return new FormulaList(head,tail);
#endif
}